

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_vstore_load(CFF_VStoreRec *vstore,FT_Stream stream,FT_ULong base_offset,FT_ULong offset
                        )

{
  FT_Memory memory;
  CFF_AxisCoords *pCVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  FT_UShort FVar5;
  FT_UShort FVar6;
  FT_UShort FVar7;
  uint uVar8;
  FT_ULong FVar9;
  undefined6 extraout_var;
  CFF_VStoreRec *pCVar10;
  CFF_VStoreRec *P;
  CFF_VStoreRec *pCVar11;
  CFF_VarRegion *pCVar12;
  CFF_AxisCoords *pCVar13;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  undefined6 extraout_var_02;
  CFF_VarData *pCVar14;
  FT_UInt *pFVar15;
  ulong uVar16;
  ulong local_60;
  CFF_AxisCoords *local_50;
  CFF_VStoreRec *local_48;
  FT_UInt local_34 [2];
  FT_Error error;
  
  memory = stream->memory;
  local_34[0] = 3;
  if (offset == 0) {
    P = (CFF_VStoreRec *)0x0;
  }
  else {
    local_34[0] = FT_Stream_Seek(stream,offset + base_offset);
    bVar3 = true;
    bVar2 = bVar3;
    if ((local_34[0] != 0) || (local_34[0] = FT_Stream_Skip(stream,2), local_34[0] != 0)) {
      P = (CFF_VStoreRec *)0x0;
      uVar8 = local_34[0];
      goto LAB_001fff8e;
    }
    FVar9 = FT_Stream_Pos(stream);
    FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
    pCVar11 = (CFF_VStoreRec *)CONCAT62(extraout_var,FVar5);
    if (local_34[0] == 0) {
      if (FVar5 != 1) {
        local_34[0] = 3;
        goto LAB_002002a1;
      }
      pCVar10 = (CFF_VStoreRec *)FT_Stream_ReadULong(stream,(FT_Error *)local_34);
      pCVar11 = pCVar10;
      if (local_34[0] != 0) goto LAB_002002a1;
      FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
      vstore->dataCount = (uint)FVar5;
      pCVar11 = vstore;
      if (local_34[0] != 0) goto LAB_002002a1;
      P = (CFF_VStoreRec *)ft_mem_realloc(memory,8,0,(ulong)FVar5,(void *)0x0,(FT_Error *)local_34);
      pCVar11 = P;
      if (local_34[0] != 0) goto LAB_002002a4;
      if (vstore->dataCount != 0) {
        uVar16 = 0;
        do {
          pCVar11 = (CFF_VStoreRec *)FT_Stream_ReadULong(stream,(FT_Error *)local_34);
          *(CFF_VStoreRec **)(&P->dataCount + uVar16 * 2) = pCVar11;
          if (local_34[0] != 0) goto LAB_002002a4;
          uVar16 = uVar16 + 1;
        } while (uVar16 < vstore->dataCount);
      }
      local_34[0] = FT_Stream_Seek(stream,(long)&pCVar10->dataCount + (FVar9 & 0xffffffff));
      pCVar11 = (CFF_VStoreRec *)(ulong)local_34[0];
      if (local_34[0] != 0) goto LAB_002002a4;
      FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
      vstore->axisCount = FVar5;
      uVar8 = (uint)local_34;
      if (local_34[0] == 0) {
        FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
        vstore->regionCount = (uint)FVar5;
        uVar8 = (uint)local_34;
        if (local_34[0] == 0) {
          pCVar12 = (CFF_VarRegion *)
                    ft_mem_realloc(memory,8,0,(ulong)FVar5,(void *)0x0,(FT_Error *)local_34);
          vstore->varRegionList = pCVar12;
          pCVar11 = (CFF_VStoreRec *)local_34;
          if (local_34[0] == 0) {
            if (vstore->regionCount != 0) {
              local_60 = 0;
              do {
                pCVar12 = vstore->varRegionList;
                pCVar13 = (CFF_AxisCoords *)
                          ft_mem_realloc(memory,0x18,0,(ulong)vstore->axisCount,(void *)0x0,
                                         (FT_Error *)local_34);
                pCVar12[local_60].axisList = pCVar13;
                bVar2 = true;
                if (local_34[0] == 0) {
                  if (vstore->axisCount == 0) {
                    bVar2 = false;
                  }
                  else {
                    local_48 = (CFF_VStoreRec *)0x10;
                    local_50 = (CFF_AxisCoords *)0x0;
                    do {
                      pCVar1 = pCVar12[local_60].axisList;
                      FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
                      pCVar13 = (CFF_AxisCoords *)CONCAT62(extraout_var_00,FVar5);
                      bVar2 = true;
                      if (local_34[0] == 0) {
                        FVar6 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
                        pCVar13 = (CFF_AxisCoords *)CONCAT62(extraout_var_01,FVar6);
                        if (local_34[0] == 0) {
                          FVar7 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
                          pCVar13 = (CFF_AxisCoords *)CONCAT62(extraout_var_02,FVar7);
                          bVar4 = false;
                          bVar2 = true;
                          if (local_34[0] == 0) {
                            *(long *)((long)pCVar1 + (long)local_48 + -0x10) =
                                 (long)(short)FVar5 << 2;
                            *(long *)((long)pCVar1 + (long)local_48 + -8) = (long)(short)FVar6 << 2;
                            pCVar13 = (CFF_AxisCoords *)((long)(short)FVar7 << 2);
                            *(CFF_AxisCoords **)((long)&pCVar1->startCoord + (long)local_48) =
                                 pCVar13;
                            bVar4 = true;
                            bVar2 = false;
                          }
                        }
                        else {
                          bVar4 = false;
                          bVar2 = true;
                        }
                      }
                      else {
                        bVar4 = false;
                      }
                      if (!bVar4) goto LAB_00200176;
                      local_50 = (CFF_AxisCoords *)((long)&local_50->startCoord + 1);
                      pCVar13 = (CFF_AxisCoords *)(ulong)vstore->axisCount;
                      local_48 = (CFF_VStoreRec *)((long)local_48 + 0x18);
                    } while (local_50 < pCVar13);
                    bVar2 = false;
                  }
                }
LAB_00200176:
                uVar8 = (uint)pCVar13;
                if (bVar2) goto LAB_001fff8e;
                local_60 = local_60 + 1;
              } while (local_60 < vstore->regionCount);
            }
            pCVar14 = (CFF_VarData *)
                      ft_mem_realloc(memory,0x10,0,(ulong)vstore->dataCount,(void *)0x0,
                                     (FT_Error *)local_34);
            vstore->varData = pCVar14;
            pCVar11 = (CFF_VStoreRec *)local_34;
            bVar2 = bVar3;
            if (local_34[0] == 0) {
              if (vstore->dataCount == 0) {
                pCVar11 = vstore;
                bVar2 = false;
              }
              else {
                local_48 = (CFF_VStoreRec *)0x0;
                do {
                  pCVar14 = vstore->varData + (long)local_48;
                  local_34[0] = FT_Stream_Seek(stream,*(long *)(&P->dataCount + (long)local_48 * 2)
                                                      + (FVar9 & 0xffffffff));
                  bVar2 = true;
                  if ((local_34[0] == 0) &&
                     (local_34[0] = FT_Stream_Skip(stream,4), local_34[0] == 0)) {
                    FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
                    pCVar14->regionIdxCount = (uint)FVar5;
                    if (local_34[0] != 0) goto LAB_00200364;
                    pFVar15 = (FT_UInt *)
                              ft_mem_realloc(memory,4,0,(ulong)FVar5,(void *)0x0,
                                             (FT_Error *)local_34);
                    pCVar14->regionIndices = pFVar15;
                    if (local_34[0] != 0) goto LAB_00200364;
                    if (pCVar14->regionIdxCount == 0) {
                      pCVar11 = (CFF_VStoreRec *)CONCAT71((int7)((ulong)pFVar15 >> 8),1);
                    }
                    else {
                      local_50 = (CFF_AxisCoords *)0x0;
                      do {
                        FVar5 = FT_Stream_ReadUShort(stream,(FT_Error *)local_34);
                        pCVar14->regionIndices[(long)local_50] = (uint)FVar5;
                        pCVar11 = (CFF_VStoreRec *)
                                  (ulong)CONCAT11((char)(FVar5 >> 8),local_34[0] == 0);
                        if (local_34[0] != 0) goto LAB_00200366;
                        local_50 = (CFF_AxisCoords *)((long)local_50 + 1);
                      } while (local_50 < (ulong)pCVar14->regionIdxCount);
                    }
                    bVar2 = false;
                  }
                  else {
LAB_00200364:
                    pCVar11 = (CFF_VStoreRec *)0x0;
                  }
LAB_00200366:
                  if ((char)pCVar11 == '\0') break;
                  local_48 = (CFF_VStoreRec *)((long)&local_48->dataCount + 1);
                  pCVar11 = (CFF_VStoreRec *)(ulong)vstore->dataCount;
                  bVar2 = false;
                } while (local_48 < pCVar11);
              }
            }
          }
          goto LAB_002002a4;
        }
      }
    }
    else {
LAB_002002a1:
      P = (CFF_VStoreRec *)0x0;
LAB_002002a4:
      uVar8 = (uint)pCVar11;
    }
LAB_001fff8e:
    if (bVar2) goto LAB_001fffa5;
    if (bVar2) {
      return uVar8;
    }
  }
  local_34[0] = 0;
LAB_001fffa5:
  ft_mem_free(memory,P);
  if (local_34[0] != 0) {
    cff_vstore_done(vstore,memory);
  }
  return local_34[0];
}

Assistant:

static FT_Error
  cff_vstore_load( CFF_VStoreRec*  vstore,
                   FT_Stream       stream,
                   FT_ULong        base_offset,
                   FT_ULong        offset )
  {
    FT_Memory  memory = stream->memory;
    FT_Error   error  = FT_ERR( Invalid_File_Format );

    FT_ULong*  dataOffsetArray = NULL;
    FT_UInt    i, j;


    /* no offset means no vstore to parse */
    if ( offset )
    {
      FT_UInt   vsOffset;
      FT_UInt   format;
      FT_ULong  regionListOffset;


      /* we need to parse the table to determine its size; */
      /* skip table length                                 */
      if ( FT_STREAM_SEEK( base_offset + offset ) ||
           FT_STREAM_SKIP( 2 )                    )
        goto Exit;

      /* actual variation store begins after the length */
      vsOffset = FT_STREAM_POS();

      /* check the header */
      if ( FT_READ_USHORT( format ) )
        goto Exit;
      if ( format != 1 )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* read top level fields */
      if ( FT_READ_ULONG( regionListOffset )   ||
           FT_READ_USHORT( vstore->dataCount ) )
        goto Exit;

      /* make temporary copy of item variation data offsets; */
      /* we'll parse region list first, then come back       */
      if ( FT_NEW_ARRAY( dataOffsetArray, vstore->dataCount ) )
        goto Exit;

      for ( i = 0; i < vstore->dataCount; i++ )
      {
        if ( FT_READ_ULONG( dataOffsetArray[i] ) )
          goto Exit;
      }

      /* parse regionList and axisLists */
      if ( FT_STREAM_SEEK( vsOffset + regionListOffset ) ||
           FT_READ_USHORT( vstore->axisCount )           ||
           FT_READ_USHORT( vstore->regionCount )         )
        goto Exit;

      if ( FT_NEW_ARRAY( vstore->varRegionList, vstore->regionCount ) )
        goto Exit;

      for ( i = 0; i < vstore->regionCount; i++ )
      {
        CFF_VarRegion*  region = &vstore->varRegionList[i];


        if ( FT_NEW_ARRAY( region->axisList, vstore->axisCount ) )
          goto Exit;

        for ( j = 0; j < vstore->axisCount; j++ )
        {
          CFF_AxisCoords*  axis = &region->axisList[j];

          FT_Int16  start14, peak14, end14;


          if ( FT_READ_SHORT( start14 ) ||
               FT_READ_SHORT( peak14 )  ||
               FT_READ_SHORT( end14 )   )
            goto Exit;

          axis->startCoord = FT_fdot14ToFixed( start14 );
          axis->peakCoord  = FT_fdot14ToFixed( peak14 );
          axis->endCoord   = FT_fdot14ToFixed( end14 );
        }
      }

      /* use dataOffsetArray now to parse varData items */
      if ( FT_NEW_ARRAY( vstore->varData, vstore->dataCount ) )
        goto Exit;

      for ( i = 0; i < vstore->dataCount; i++ )
      {
        CFF_VarData*  data = &vstore->varData[i];


        if ( FT_STREAM_SEEK( vsOffset + dataOffsetArray[i] ) )
          goto Exit;

        /* ignore `itemCount' and `shortDeltaCount' */
        /* because CFF2 has no delta sets           */
        if ( FT_STREAM_SKIP( 4 ) )
          goto Exit;

        /* Note: just record values; consistency is checked later    */
        /*       by cff_blend_build_vector when it consumes `vstore' */

        if ( FT_READ_USHORT( data->regionIdxCount ) )
          goto Exit;

        if ( FT_NEW_ARRAY( data->regionIndices, data->regionIdxCount ) )
          goto Exit;

        for ( j = 0; j < data->regionIdxCount; j++ )
        {
          if ( FT_READ_USHORT( data->regionIndices[j] ) )
            goto Exit;
        }
      }
    }

    error = FT_Err_Ok;

  Exit:
    FT_FREE( dataOffsetArray );
    if ( error )
      cff_vstore_done( vstore, memory );

    return error;
  }